

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

int __thiscall cmake::CheckBuildSystem(cmake *this)

{
  pointer pcVar1;
  cmGlobalGenerator *globalGenerator;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  string *psVar5;
  cmValue value;
  undefined8 uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  uint uVar8;
  _Base_ptr f2;
  bool bVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  string dep_newest;
  string out_oldest;
  int result_2;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> ggd;
  cmList outputs;
  cmList depends;
  cmList products;
  ostringstream msg_1;
  cmMakefile mf;
  cmake cm;
  cmGlobalGenerator gg;
  undefined1 local_2c30 [56];
  string local_2bf8;
  int local_2bcc;
  undefined1 local_2bc8 [32];
  cmList local_2ba8;
  cmList local_2b88;
  cmList local_2b70;
  undefined1 local_2b58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b38;
  _Alloc_hider local_2b28;
  _Elt_pointer local_2b20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b18 [3];
  ios_base local_2ae8 [3408];
  undefined1 local_1d98 [112];
  ios_base local_1d28 [3416];
  cmake local_fd0;
  cmGlobalGenerator local_728;
  
  bVar2 = cmsys::SystemTools::HasEnv("VERBOSE");
  if (bVar2) {
    bVar2 = cmsys::SystemTools::HasEnv("CMAKE_NO_VERBOSE");
    bVar2 = !bVar2;
  }
  else {
    bVar2 = false;
  }
  if ((this->CheckBuildSystemArgument)._M_string_length == 0) {
    if (bVar2 == false) {
      return 1;
    }
    local_1d98._0_8_ = local_1d98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d98,"Re-run cmake no build system arguments\n","");
    cmSystemTools::Stdout((string *)local_1d98);
    if ((undefined1 *)local_1d98._0_8_ == local_1d98 + 0x10) {
      return 1;
    }
    operator_delete((void *)local_1d98._0_8_,local_1d98._16_8_ + 1);
    return 1;
  }
  bVar3 = cmsys::SystemTools::FileExists(&this->CheckBuildSystemArgument);
  if (!bVar3) {
    if (bVar2 == false) {
      return 1;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d98);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d98,"Re-run cmake missing file: ",0x1b);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d98,(this->CheckBuildSystemArgument)._M_dataplus._M_p,
                        (this->CheckBuildSystemArgument)._M_string_length);
    local_2b58[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2b58,1);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout((string *)local_2b58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b58._0_8_ != &local_2b48) {
      operator_delete((void *)local_2b58._0_8_,local_2b48._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d98);
    std::ios_base::~ios_base(local_1d28);
    return 1;
  }
  cmake(&local_fd0,RoleScript,Unknown,Normal);
  pcVar1 = local_1d98 + 0x10;
  local_1d98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d98,"");
  SetHomeDirectory(&local_fd0,(string *)local_1d98);
  if ((pointer)local_1d98._0_8_ != pcVar1) {
    operator_delete((void *)local_1d98._0_8_,local_1d98._16_8_ + 1);
  }
  local_1d98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d98,"");
  SetHomeOutputDirectory(&local_fd0,(string *)local_1d98);
  if ((pointer)local_1d98._0_8_ != pcVar1) {
    operator_delete((void *)local_1d98._0_8_,local_1d98._16_8_ + 1);
  }
  local_1d98._16_8_ = local_fd0.CurrentSnapshot.Position.Position;
  local_1d98._0_8_ = local_fd0.CurrentSnapshot.State;
  local_1d98._8_8_ = local_fd0.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_1d98);
  cmGlobalGenerator::cmGlobalGenerator(&local_728,&local_fd0);
  local_2b48._M_allocated_capacity = local_fd0.CurrentSnapshot.Position.Position;
  local_2b58._0_8_ = local_fd0.CurrentSnapshot.State;
  local_2b58._8_8_ = local_fd0.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile((cmMakefile *)local_1d98,&local_728,(cmStateSnapshot *)local_2b58);
  bVar3 = cmMakefile::ReadListFile((cmMakefile *)local_1d98,&this->CheckBuildSystemArgument);
  if ((((!bVar3) || (cmSystemTools::s_ErrorOccurred != false)) ||
      (cmSystemTools::s_FatalErrorOccurred != false)) ||
     (bVar3 = cmSystemTools::GetInterruptFlag(), bVar3)) {
    uVar8 = 1;
    if (bVar2 != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b58);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2b58,"Re-run cmake error reading : ",0x1d);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_2b58,(this->CheckBuildSystemArgument)._M_dataplus._M_p,
                          (this->CheckBuildSystemArgument)._M_string_length);
      local_2c30[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2c30,1);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout((string *)local_2c30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c30._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_2c30 + 0x10)) {
        operator_delete((void *)local_2c30._0_8_,(ulong)(local_2c30._16_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b58);
      std::ios_base::~ios_base(local_2ae8);
    }
    goto LAB_002767b1;
  }
  if (this->ClearBuildSystem == true) {
    local_2b58._0_8_ = &local_2b48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2b58,"CMAKE_DEPENDS_GENERATOR","");
    psVar5 = cmMakefile::GetSafeDefinition((cmMakefile *)local_1d98,(string *)local_2b58);
    pcVar1 = (psVar5->_M_dataplus)._M_p;
    local_2c30._0_8_ = local_2c30 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2c30,pcVar1,pcVar1 + psVar5->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b58._0_8_ != &local_2b48) {
      operator_delete((void *)local_2b58._0_8_,(ulong)(local_2b48._M_allocated_capacity + 1));
    }
    if (local_2c30._8_8_ == 0) {
      std::__cxx11::string::operator=((string *)local_2c30,"Unix Makefiles");
    }
    CreateGlobalGenerator((cmake *)local_2bc8,(string *)this,SUB81(local_2c30,0));
    globalGenerator = (cmGlobalGenerator *)CONCAT44(local_2bc8._4_4_,local_2bc8._0_4_);
    if (globalGenerator != (cmGlobalGenerator *)0x0) {
      local_2b48._M_allocated_capacity = local_fd0.CurrentSnapshot.Position.Position;
      local_2b58._0_8_ = local_fd0.CurrentSnapshot.State;
      local_2b58._8_8_ = local_fd0.CurrentSnapshot.Position.Tree;
      cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_2b58);
      local_2bf8.field_2._M_allocated_capacity = local_fd0.CurrentSnapshot.Position.Position;
      local_2bf8._M_dataplus._M_p = (pointer)local_fd0.CurrentSnapshot.State;
      local_2bf8._M_string_length = (size_type)local_fd0.CurrentSnapshot.Position.Tree;
      cmMakefile::cmMakefile
                ((cmMakefile *)local_2b58,globalGenerator,(cmStateSnapshot *)&local_2bf8);
      (*globalGenerator->_vptr_cmGlobalGenerator[2])(&local_2bf8,globalGenerator,local_2b58);
      (**(code **)(*(size_type *)local_2bf8._M_dataplus._M_p + 0x60))
                (local_2bf8._M_dataplus._M_p,local_2b58,bVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2bf8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_2bf8._M_dataplus._M_p + 8))();
      }
      cmMakefile::~cmMakefile((cmMakefile *)local_2b58);
      (*globalGenerator->_vptr_cmGlobalGenerator[1])(globalGenerator);
    }
    if ((undefined1 *)local_2c30._0_8_ != local_2c30 + 0x10) {
      operator_delete((void *)local_2c30._0_8_,(ulong)(local_2c30._16_8_ + 1));
    }
  }
  local_2c30._0_8_ = local_2c30 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c30,"CMAKE_MAKEFILE_PRODUCTS","")
  ;
  psVar5 = (string *)cmMakefile::GetDefinition((cmMakefile *)local_1d98,(string *)local_2c30);
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  local_2b58._0_8_ = &local_2b48;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2b58,pcVar1,pcVar1 + psVar5->_M_string_length);
  init._M_len = 1;
  init._M_array = (iterator)local_2b58;
  cmList::cmList(&local_2b70,init);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b58._0_8_ != &local_2b48) {
    operator_delete((void *)local_2b58._0_8_,(ulong)(local_2b48._M_allocated_capacity + 1));
  }
  psVar5 = local_2b70.Values.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c30._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_2c30 + 0x10)) {
    operator_delete((void *)local_2c30._0_8_,(ulong)(local_2c30._16_8_ + 1));
    psVar5 = local_2b70.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  for (; psVar5 != local_2b70.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; psVar5 = psVar5 + 1) {
    bVar3 = cmsys::SystemTools::PathExists(psVar5);
    if (!bVar3) {
      if (bVar2 != false) {
        local_2b58._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x21;
        local_2b58._8_8_ = "Re-run cmake, missing byproduct: ";
        local_2b48._M_allocated_capacity = 0;
        local_2b38._M_allocated_capacity = (size_type)(psVar5->_M_dataplus)._M_p;
        local_2b48._8_8_ = psVar5->_M_string_length;
        local_2b38._8_8_ = 0;
        local_2c30._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_2c30._8_8_ = 1;
        local_2c30._16_8_ = local_2c30 + 0x18;
        local_2c30[0x18] = '\n';
        local_2b28._M_p = &DAT_00000001;
        local_2b18[0]._M_allocated_capacity = 0;
        views._M_len = 3;
        views._M_array = (iterator)local_2b58;
        local_2b20 = (_Elt_pointer)local_2c30._16_8_;
        cmCatViews(&local_2bf8,views);
        cmSystemTools::Stdout(&local_2bf8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2bf8._M_dataplus._M_p != &local_2bf8.field_2) {
          operator_delete(local_2bf8._M_dataplus._M_p,
                          (ulong)(local_2bf8.field_2._M_allocated_capacity + 1));
        }
      }
      if (!bVar3) {
        uVar8 = 1;
        goto LAB_0027718d;
      }
    }
  }
  local_2c30._0_8_ = local_2c30 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c30,"CMAKE_MAKEFILE_DEPENDS","");
  psVar5 = (string *)cmMakefile::GetDefinition((cmMakefile *)local_1d98,(string *)local_2c30);
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  local_2b58._0_8_ = &local_2b48;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2b58,pcVar1,pcVar1 + psVar5->_M_string_length);
  init_00._M_len = 1;
  init_00._M_array = (iterator)local_2b58;
  cmList::cmList(&local_2b88,init_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b58._0_8_ != &local_2b48) {
    operator_delete((void *)local_2b58._0_8_,(ulong)(local_2b48._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c30._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_2c30 + 0x10)) {
    operator_delete((void *)local_2c30._0_8_,(ulong)(local_2c30._16_8_ + 1));
  }
  local_2ba8.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_2ba8.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_2ba8.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_2b88.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2b88.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_2b58._0_8_ = &local_2b48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2b58,"CMAKE_MAKEFILE_OUTPUTS","");
    value = cmMakefile::GetDefinition((cmMakefile *)local_1d98,(string *)local_2b58);
    cmList::assign(&local_2ba8,value,Yes,No);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b58._0_8_ != &local_2b48) {
      operator_delete((void *)local_2b58._0_8_,(ulong)(local_2b48._M_allocated_capacity + 1));
    }
  }
  if ((local_2b88.Values.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_2b88.Values.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (local_2ba8.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2ba8.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    local_2c30._0_8_ = local_2c30 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2c30,
               *(long *)local_2b88.Values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
               (long)&((_Base_ptr)
                      (local_2b88.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length)->_M_color +
               *(long *)local_2b88.Values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    f2 = (_Base_ptr)
         local_2b88.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    do {
      psVar5 = local_2ba8.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      f2 = f2 + 1;
      if (f2 == (_Base_ptr)
                local_2b88.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
        local_2bf8._M_dataplus._M_p = (pointer)&local_2bf8.field_2;
        pcVar1 = ((local_2ba8.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2bf8,pcVar1,
                   pcVar1 + (local_2ba8.Values.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
        goto LAB_00276f62;
      }
      local_2bf8._M_dataplus._M_p = local_2bf8._M_dataplus._M_p & 0xffffffff00000000;
      bVar3 = cmFileTimeCache::Compare
                        ((this->FileTimeCache)._M_t.
                         super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>
                         .super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl,
                         (string *)local_2c30,(string *)f2,(int *)&local_2bf8);
      if (bVar3) {
        if ((int)local_2bf8._M_dataplus._M_p < 0) {
          std::__cxx11::string::_M_assign((string *)local_2c30);
        }
      }
      else if (bVar2 != false) {
        local_2b58._0_8_ = &local_2b48;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2b58,"Re-run cmake: build system dependency is missing\n","");
        cmSystemTools::Stdout((string *)local_2b58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b58._0_8_ != &local_2b48) {
          operator_delete((void *)local_2b58._0_8_,(ulong)(local_2b48._M_allocated_capacity + 1));
        }
      }
    } while (bVar3);
    uVar8 = 1;
    goto LAB_00277157;
  }
  uVar8 = 1;
  if (bVar2 != false) {
    local_2b58._0_8_ = &local_2b48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2b58,
               "Re-run cmake no CMAKE_MAKEFILE_DEPENDS or CMAKE_MAKEFILE_OUTPUTS :\n","");
    cmSystemTools::Stdout((string *)local_2b58);
    uVar6 = local_2b48._M_allocated_capacity;
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_2b58._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b58._0_8_ != &local_2b48) goto LAB_0027716b;
  }
  goto LAB_00277173;
  while( true ) {
    local_2bc8._0_4_ = 0;
    bVar3 = cmFileTimeCache::Compare
                      ((this->FileTimeCache)._M_t.
                       super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>
                       .super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl,&local_2bf8,
                       psVar5,(int *)local_2bc8);
    if (bVar3) {
      if (0 < (int)local_2bc8._0_4_) {
        std::__cxx11::string::_M_assign((string *)&local_2bf8);
      }
    }
    else if (bVar2 != false) {
      local_2b58._0_8_ = &local_2b48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2b58,"Re-run cmake: build system output is missing\n","");
      cmSystemTools::Stdout((string *)local_2b58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b58._0_8_ != &local_2b48) {
        operator_delete((void *)local_2b58._0_8_,(ulong)(local_2b48._M_allocated_capacity + 1));
      }
    }
    if (!bVar3) break;
LAB_00276f62:
    psVar5 = psVar5 + 1;
    if (psVar5 == local_2ba8.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      local_2bcc = 0;
      bVar3 = cmFileTimeCache::Compare
                        ((this->FileTimeCache)._M_t.
                         super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>
                         .super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl,&local_2bf8,
                         (string *)local_2c30,&local_2bcc);
      bVar9 = local_2bcc < 0;
      if (bVar2 == true && (!bVar3 || bVar9)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b58);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2b58,"Re-run cmake file: ",0x13);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_2b58,local_2bf8._M_dataplus._M_p,
                            local_2bf8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," older than: ",0xd);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_2c30._0_8_,local_2c30._8_8_);
        local_2bc8[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2bc8,1);
        std::__cxx11::stringbuf::str();
        cmSystemTools::Stdout((string *)local_2bc8);
        if ((undefined1 *)CONCAT44(local_2bc8._4_4_,local_2bc8._0_4_) != local_2bc8 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2bc8._4_4_,local_2bc8._0_4_),
                          (ulong)(local_2bc8._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b58);
        std::ios_base::~ios_base(local_2ae8);
      }
      uVar8 = (uint)(!bVar3 || bVar9);
      goto LAB_0027713b;
    }
  }
  uVar8 = 1;
LAB_0027713b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2bf8._M_dataplus._M_p != &local_2bf8.field_2) {
    operator_delete(local_2bf8._M_dataplus._M_p,
                    (ulong)(local_2bf8.field_2._M_allocated_capacity + 1));
  }
LAB_00277157:
  uVar6 = local_2c30._16_8_;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_2c30._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c30._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_2c30 + 0x10)) {
LAB_0027716b:
    operator_delete(paVar7,(ulong)(uVar6 + 1));
  }
LAB_00277173:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2ba8.Values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b88.Values);
LAB_0027718d:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b70.Values);
LAB_002767b1:
  cmMakefile::~cmMakefile((cmMakefile *)local_1d98);
  cmGlobalGenerator::~cmGlobalGenerator(&local_728);
  ~cmake(&local_fd0);
  return uVar8;
}

Assistant:

int cmake::CheckBuildSystem()
{
  // We do not need to rerun CMake.  Check dependency integrity.
  const bool verbose = isCMakeVerbose();

  // This method will check the integrity of the build system if the
  // option was given on the command line.  It reads the given file to
  // determine whether CMake should rerun.

  // If no file is provided for the check, we have to rerun.
  if (this->CheckBuildSystemArgument.empty()) {
    if (verbose) {
      cmSystemTools::Stdout("Re-run cmake no build system arguments\n");
    }
    return 1;
  }

  // If the file provided does not exist, we have to rerun.
  if (!cmSystemTools::FileExists(this->CheckBuildSystemArgument)) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake missing file: " << this->CheckBuildSystemArgument
          << '\n';
      cmSystemTools::Stdout(msg.str());
    }
    return 1;
  }

  // Read the rerun check file and use it to decide whether to do the
  // global generate.
  // Actually, all we need is the `set` command.
  cmake cm(RoleScript, cmState::Unknown);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  if (!mf.ReadListFile(this->CheckBuildSystemArgument) ||
      cmSystemTools::GetErrorOccurredFlag()) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake error reading : " << this->CheckBuildSystemArgument
          << '\n';
      cmSystemTools::Stdout(msg.str());
    }
    // There was an error reading the file.  Just rerun.
    return 1;
  }

  if (this->ClearBuildSystem) {
    // Get the generator used for this build system.
    std::string genName = mf.GetSafeDefinition("CMAKE_DEPENDS_GENERATOR");
    if (!cmNonempty(genName)) {
      genName = "Unix Makefiles";
    }

    // Create the generator and use it to clear the dependencies.
    std::unique_ptr<cmGlobalGenerator> ggd =
      this->CreateGlobalGenerator(genName);
    if (ggd) {
      cm.GetCurrentSnapshot().SetDefaultDefinitions();
      cmMakefile mfd(ggd.get(), cm.GetCurrentSnapshot());
      auto lgd = ggd->CreateLocalGenerator(&mfd);
      lgd->ClearDependencies(&mfd, verbose);
    }
  }

  // If any byproduct of makefile generation is missing we must re-run.
  cmList products{ mf.GetDefinition("CMAKE_MAKEFILE_PRODUCTS") };
  for (auto const& p : products) {
    if (!cmSystemTools::PathExists(p)) {
      if (verbose) {
        cmSystemTools::Stdout(
          cmStrCat("Re-run cmake, missing byproduct: ", p, '\n'));
      }
      return 1;
    }
  }

  // Get the set of dependencies and outputs.
  cmList depends{ mf.GetDefinition("CMAKE_MAKEFILE_DEPENDS") };
  cmList outputs;
  if (!depends.empty()) {
    outputs.assign(mf.GetDefinition("CMAKE_MAKEFILE_OUTPUTS"));
  }
  if (depends.empty() || outputs.empty()) {
    // Not enough information was provided to do the test.  Just rerun.
    if (verbose) {
      cmSystemTools::Stdout("Re-run cmake no CMAKE_MAKEFILE_DEPENDS "
                            "or CMAKE_MAKEFILE_OUTPUTS :\n");
    }
    return 1;
  }

  // Find the newest dependency.
  auto dep = depends.begin();
  std::string dep_newest = *dep++;
  for (; dep != depends.end(); ++dep) {
    int result = 0;
    if (this->FileTimeCache->Compare(dep_newest, *dep, &result)) {
      if (result < 0) {
        dep_newest = *dep;
      }
    } else {
      if (verbose) {
        cmSystemTools::Stdout(
          "Re-run cmake: build system dependency is missing\n");
      }
      return 1;
    }
  }

  // Find the oldest output.
  auto out = outputs.begin();
  std::string out_oldest = *out++;
  for (; out != outputs.end(); ++out) {
    int result = 0;
    if (this->FileTimeCache->Compare(out_oldest, *out, &result)) {
      if (result > 0) {
        out_oldest = *out;
      }
    } else {
      if (verbose) {
        cmSystemTools::Stdout(
          "Re-run cmake: build system output is missing\n");
      }
      return 1;
    }
  }

  // If any output is older than any dependency then rerun.
  {
    int result = 0;
    if (!this->FileTimeCache->Compare(out_oldest, dep_newest, &result) ||
        result < 0) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake file: " << out_oldest
            << " older than: " << dep_newest << '\n';
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // No need to rerun.
  return 0;
}